

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::LWO::AnimResolver::InterpolateTrack
          (AnimResolver *this,vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out,
          aiVectorKey *fill,double time)

{
  bool bVar1;
  reference pKVar2;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_68;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_60;
  Key *local_58;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_50;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_48;
  Key *local_40;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_38;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_30;
  double local_28;
  double time_local;
  aiVectorKey *fill_local;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out_local;
  AnimResolver *this_local;
  
  local_28 = time;
  time_local = (double)fill;
  fill_local = (aiVectorKey *)out;
  out_local = (vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)this;
  if ((this->flags & 1) != 0) {
    SubsampleAnimTrack(this,out,time,this->sample_delta);
  }
  *(double *)time_local = local_28;
  pKVar2 = __gnu_cxx::
           __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
           ::operator*(&this->cur_x);
  if ((pKVar2->time != local_28) || (NAN(pKVar2->time) || NAN(local_28))) {
    local_40 = (this->cur_x)._M_current;
    DoInterpolation(this,(const_iterator)local_40,this->envl_x,local_28,
                    (float *)((long)time_local + 8));
  }
  else {
    pKVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_x);
    *(float *)((long)time_local + 8) = pKVar2->value;
    local_38._M_current =
         (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                          (&this->envl_x->keys);
    local_30 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator-(&local_38,1);
    bVar1 = __gnu_cxx::operator!=(&this->cur_x,&local_30);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
      ::operator++(&this->cur_x);
    }
    else {
      this->end_x = true;
    }
  }
  pKVar2 = __gnu_cxx::
           __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
           ::operator*(&this->cur_y);
  if ((pKVar2->time != local_28) || (NAN(pKVar2->time) || NAN(local_28))) {
    local_58 = (this->cur_y)._M_current;
    DoInterpolation(this,(const_iterator)local_58,this->envl_y,local_28,
                    (float *)((long)time_local + 0xc));
  }
  else {
    pKVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_y);
    *(float *)((long)time_local + 0xc) = pKVar2->value;
    local_50._M_current =
         (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                          (&this->envl_y->keys);
    local_48 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator-(&local_50,1);
    bVar1 = __gnu_cxx::operator!=(&this->cur_y,&local_48);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
      ::operator++(&this->cur_y);
    }
    else {
      this->end_y = true;
    }
  }
  pKVar2 = __gnu_cxx::
           __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
           ::operator*(&this->cur_z);
  if ((pKVar2->time != local_28) || (NAN(pKVar2->time) || NAN(local_28))) {
    DoInterpolation(this,(this->cur_z)._M_current,this->envl_z,local_28,
                    (float *)((long)time_local + 0x10));
  }
  else {
    pKVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_z);
    *(float *)((long)time_local + 0x10) = pKVar2->value;
    local_68._M_current =
         (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                          (&this->envl_z->keys);
    local_60 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator-(&local_68,1);
    bVar1 = __gnu_cxx::operator!=(&this->cur_z,&local_60);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
      ::operator++(&this->cur_z);
    }
    else {
      this->end_x = true;
    }
  }
  return;
}

Assistant:

void AnimResolver::InterpolateTrack(std::vector<aiVectorKey>& out,aiVectorKey& fill,double time)
{
    // subsample animation track?
    if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
        SubsampleAnimTrack(out,time, sample_delta);
    }

    fill.mTime = time;

    // get x
    if ((*cur_x).time == time) {
        fill.mValue.x = (*cur_x).value;

        if (cur_x != envl_x->keys.end()-1) /* increment x */
            ++cur_x;
        else end_x = true;
    }
    else DoInterpolation(cur_x,envl_x,time,(float&)fill.mValue.x);

    // get y
    if ((*cur_y).time == time) {
        fill.mValue.y = (*cur_y).value;

        if (cur_y != envl_y->keys.end()-1) /* increment y */
            ++cur_y;
        else end_y = true;
    }
    else DoInterpolation(cur_y,envl_y,time,(float&)fill.mValue.y);

    // get z
    if ((*cur_z).time == time) {
        fill.mValue.z = (*cur_z).value;

        if (cur_z != envl_z->keys.end()-1) /* increment z */
            ++cur_z;
        else end_x = true;
    }
    else DoInterpolation(cur_z,envl_z,time,(float&)fill.mValue.z);
}